

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspAppOptions::initOptions(ClaspAppOptions *this,OptionContext *root)

{
  OptionInitHelper desc;
  OptionContext *this_00;
  OptionGroup *options;
  OptionInitHelper *v;
  OptionGroup *this_01;
  Value *in_RDI;
  OptionGroup basic;
  OptionGroup *in_stack_fffffffffffffde8;
  Value *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  OptionGroup *in_stack_fffffffffffffe00;
  type in_stack_fffffffffffffe08;
  ClaspAppOptions *in_stack_fffffffffffffe10;
  allocator *name;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar1;
  allocator local_71;
  string local_70 [112];
  
  name = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Basic Options",name);
  Potassco::ProgramOptions::OptionGroup::OptionGroup
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (DescriptionLevel)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  desc = Potassco::ProgramOptions::OptionGroup::addOptions(in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::flag
            ((bool *)in_stack_fffffffffffffde8,
             (FlagAction)(Action)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::notify<Clasp::Cli::ClaspAppOptions>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Potassco::ProgramOptions::Value::implicit
            (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::Value::arg(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::notify<Clasp::Cli::ClaspAppOptions>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Potassco::ProgramOptions::Value::arg(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::Value::implicit
            (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::storeTo<unsigned_int>
            ((uint *)in_stack_fffffffffffffe00,(type)in_stack_fffffffffffffdf8);
  Potassco::ProgramOptions::Value::arg(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::storeTo<std::__cxx11::string>
            (&in_stack_fffffffffffffe00->caption_,(type)in_stack_fffffffffffffdf8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::notify<Clasp::Cli::ClaspAppOptions>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::flag
            ((bool *)in_stack_fffffffffffffde8,
             (FlagAction)(Action)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::storeTo<std::__cxx11::string>
            (&in_stack_fffffffffffffe00->caption_,(type)in_stack_fffffffffffffdf8);
  Potassco::ProgramOptions::Value::arg(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  this_00 = (OptionContext *)
            Potassco::ProgramOptions::storeTo<std::__cxx11::string>
                      (&in_stack_fffffffffffffe00->caption_,(type)in_stack_fffffffffffffdf8);
  options = (OptionGroup *)
            Potassco::ProgramOptions::Value::arg
                      (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::storeTo<unsigned_int>
            ((uint *)in_stack_fffffffffffffe00,(type)in_stack_fffffffffffffdf8);
  Potassco::ProgramOptions::Value::arg(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::storeTo<unsigned_int>
            ((uint *)in_stack_fffffffffffffe00,(type)in_stack_fffffffffffffdf8);
  Potassco::ProgramOptions::Value::arg(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  Potassco::ProgramOptions::notify<Clasp::Cli::ClaspAppOptions>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)name,in_RDI,(char *)desc.owner_);
  uVar1 = Potassco::ProgramOptions::store_true;
  Potassco::ProgramOptions::flag
            ((bool *)in_stack_fffffffffffffde8,
             (FlagAction)(Action)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(uVar1,in_stack_ffffffffffffff60),(char *)name,in_RDI,
             (char *)desc.owner_);
  Potassco::ProgramOptions::storeTo<std::__cxx11::string>
            (&in_stack_fffffffffffffe00->caption_,(type)in_stack_fffffffffffffdf8);
  Potassco::ProgramOptions::Value::arg(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(uVar1,in_stack_ffffffffffffff60),(char *)name,in_RDI,
             (char *)desc.owner_);
  Potassco::ProgramOptions::
  storeTo<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffe00,(type)in_stack_fffffffffffffdf8);
  Potassco::ProgramOptions::Value::composing(in_stack_fffffffffffffdf0);
  v = Potassco::ProgramOptions::OptionInitHelper::operator()
                ((OptionInitHelper *)CONCAT44(uVar1,in_stack_ffffffffffffff60),(char *)name,in_RDI,
                 (char *)desc.owner_);
  Potassco::ProgramOptions::storeTo<int>((int *)v,(type)in_stack_fffffffffffffdf8);
  this_01 = (OptionGroup *)
            Potassco::ProgramOptions::Value::arg
                      (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  Potassco::ProgramOptions::OptionInitHelper::operator()
            ((OptionInitHelper *)CONCAT44(uVar1,in_stack_ffffffffffffff60),(char *)name,in_RDI,
             (char *)desc.owner_);
  Potassco::ProgramOptions::OptionContext::add(this_00,options);
  Potassco::ProgramOptions::OptionGroup::~OptionGroup(this_01);
  return;
}

Assistant:

void ClaspAppOptions::initOptions(Potassco::ProgramOptions::OptionContext& root) {
	using namespace Potassco::ProgramOptions;
	OptionGroup basic("Basic Options");
	basic.addOptions()
		("print-portfolio,@1", flag(printPort), "Print default portfolio and exit")
		("quiet,q"    , notify(this, &ClaspAppOptions::mappedOpts)->implicit("2,2,2")->arg("<levels>"),
		 "Configure printing of models, costs, and calls\n"
		 "      %A: <mod>[,<cost>][,<call>]\n"
		 "        <mod> : print {0=all|1=last|2=no} models\n"
		 "        <cost>: print {0=all|1=last|2=no} optimize values [<mod>]\n"
		 "        <call>: print {0=all|1=last|2=no} call steps      [2]")
		("pre", notify(this, &ClaspAppOptions::mappedOpts)->arg("<fmt>")->implicit("aspif"), "Print simplified program and exit\n"
		 "      %A: Set output format to {aspif|smodels} (implicit: %I)")
		("outf,@1", storeTo(outf)->arg("<n>"), "Use {0=default|1=competition|2=JSON|3=no} output")
		("out-atomf,@2" , storeTo(outAtom), "Set atom format string (<Pre>?%%0<Post>?)")
		("out-ifs,@2"   , notify(this, &ClaspAppOptions::mappedOpts), "Set internal field separator")
		("out-hide-aux,@1" , flag(hideAux), "Hide auxiliary atoms in answers")
		("lemma-in,@1"     , storeTo(lemmaIn)->arg("<file>"), "Read additional lemmas from %A")
		("lemma-out,@1"    , storeTo(lemmaLog)->arg("<file>"), "Log learnt lemmas to %A")
		("lemma-out-lbd,@2", storeTo(lemma.lbdMax)->arg("<n>"), "Only log lemmas with lbd <= %A")
		("lemma-out-max,@2", storeTo(lemma.logMax)->arg("<n>"), "Stop logging after %A lemmas")
		("lemma-out-dom,@2", notify(this, &ClaspAppOptions::mappedOpts), "Log lemmas over <arg {input|output}> variables")
		("lemma-out-txt,@2", flag(lemma.logText), "Log lemmas as ground integrity constraints")
		("hcc-out,@2", storeTo(hccOut)->arg("<file>"), "Write non-hcf programs to %A.#scc")
		("file,f,@3" , storeTo(input)->composing(), "Input files")
		("compute,@2", storeTo(compute)->arg("<lit>"), "Force given literal to true")
	;
	root.add(basic);
}